

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O2

void __thiscall ClientMonitor::removeAllClients(ClientMonitor *this)

{
  pointer ppCVar1;
  Client *this_00;
  int i;
  ulong uVar2;
  
  std::mutex::lock(&this->clientListAccess);
  for (uVar2 = 0;
      ppCVar1 = (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = ppCVar1[uVar2];
    if (this_00 != (Client *)0x0) {
      Client::~Client(this_00);
      operator_delete(this_00);
    }
  }
  Selector::clear(this->selector);
  ppCVar1 = (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar1) {
    (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar1;
  }
  std::
  _Hashtable<TCPSocket,_std::pair<const_TCPSocket,_Client_*>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>,_std::__detail::_Select1st,_std::equal_to<TCPSocket>,_std::hash<TCPSocket>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->socketToClientMap)._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void ClientMonitor::removeAllClients() {
    std::lock_guard<std::mutex> lock(clientListAccess);
    for(int i = 0; i < clients.size(); i++){
        if(clients[i] != nullptr){
            delete clients[i];
        }
    }

    selector.clear();
    clients.clear();
    socketToClientMap.clear();
}